

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * __thiscall
lest::
to_string<nonstd::span_lite::span<char,18446744073709551615ul>,nonstd::span_lite::span<int,18446744073709551615ul>>
          (string *__return_storage_ptr__,lest *this,span<char,_18446744073709551615UL> *lhs,
          string *op,span<int,_18446744073709551615UL> *rhs)

{
  ostream *poVar1;
  span<char,_18446744073709551615UL> *value;
  span<int,_18446744073709551615UL> *value_00;
  ostringstream os;
  string sStack_1d8;
  string local_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  to_string<nonstd::span_lite::span<char,18446744073709551615ul>>(&sStack_1d8,this,value);
  poVar1 = std::operator<<((ostream *)local_198,(string *)&sStack_1d8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  to_string<nonstd::span_lite::span<int,18446744073709551615ul>>(&local_1b8,(lest *)op,value_00);
  std::operator<<(poVar1,(string *)&local_1b8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&sStack_1d8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}